

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O2

void __thiscall Fl_Check_Browser::item_select(Fl_Check_Browser *this,void *v,int state)

{
  bool bVar1;
  
  if (state != 0) {
    bVar1 = *(char *)((long)v + 0x10) == '\0';
    *(bool *)((long)v + 0x10) = bVar1;
    this->nchecked_ = this->nchecked_ + (uint)bVar1 * 2 + -1;
  }
  return;
}

Assistant:

void Fl_Check_Browser::item_select(void *v, int state) {
	cb_item *i = (cb_item *)v;

	if (state) {
		if (i->checked) {
			i->checked = 0;
			nchecked_--;
		} else {
			i->checked = 1;
			nchecked_++;
		}
	}
}